

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

void __thiscall
QCommandLineParserPrivate::showHelp
          (QCommandLineParserPrivate *this,int exitCode,bool includeQtOptions)

{
  long in_FS_OFFSET;
  QString QStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  helpText(&QStack_28,this,includeQtOptions);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    QCommandLineParser::showMessageAndExit(Information,&QStack_28,exitCode);
  }
  __stack_chk_fail();
}

Assistant:

Q_NORETURN void QCommandLineParserPrivate::showHelp(int exitCode, bool includeQtOptions)
{
    QCommandLineParser::showMessageAndExit(QCommandLineParser::MessageType::Information,
                                           helpText(includeQtOptions),
                                           exitCode);
}